

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

BlockInfo * __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetBlockInfo
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  BlockInfo *pBVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  pBVar1 = HeapInfo::GetBlockInfo<SmallAllocationBlockAttributes>((uint)this->objectSize);
  return pBVar1;
}

Assistant:

typename SmallHeapBlockT<TBlockAttributes>::BlockInfo const*
SmallHeapBlockT<TBlockAttributes>::GetBlockInfo()
{
    return HeapInfo::GetBlockInfo<TBlockAttributes>(objectSize);
}